

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool el::base::utils::Str::wildCardMatch(char *str,char *pattern)

{
  char cVar1;
  bool bVar2;
  
  do {
    cVar1 = *pattern;
    if (cVar1 == '?') {
      if (*str == '\0') {
        return false;
      }
    }
    else {
      if (cVar1 == '\0') {
        return *str == '\0';
      }
      if (cVar1 == '*') {
        bVar2 = wildCardMatch(str,pattern + 1);
        if (bVar2) {
          return true;
        }
        if ((*str != '\0') && (bVar2 = wildCardMatch(str + 1,pattern), bVar2)) {
          return true;
        }
        return false;
      }
      if (*str != cVar1) {
        return false;
      }
    }
    pattern = pattern + 1;
    str = str + 1;
  } while( true );
}

Assistant:

bool Str::wildCardMatch(const char* str, const char* pattern) {
  while (*pattern) {
    switch (*pattern) {
    case '?':
      if (!*str)
        return false;
      ++str;
      ++pattern;
      break;
    case '*':
      if (wildCardMatch(str, pattern + 1))
        return true;
      if (*str && wildCardMatch(str + 1, pattern))
        return true;
      return false;
    default:
      if (*str++ != *pattern++)
        return false;
      break;
    }
  }
  return !*str && !*pattern;
}